

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

int __thiscall Server::hexCharToInt(Server *this,char input)

{
  int iVar1;
  undefined3 in_register_00000031;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000031,input);
  if ((byte)(input - 0x30U) < 10) {
    return iVar2 + -0x30;
  }
  if ((byte)(input + 0xbfU) < 6) {
    return iVar2 + -0x37;
  }
  iVar1 = -1;
  if ((byte)(input + 0x9fU) < 6) {
    iVar1 = iVar2 + -0x57;
  }
  return iVar1;
}

Assistant:

int Server::hexCharToInt(char input) {
    if (input >= '0' && input <= '9') {
        return input - '0';
    } else if (input >= 'A' && input <= 'F') {
        return input - 'A' + 10;
    } else if (input >= 'a' && input <= 'f') {
        return input - 'a' + 10;
    } else {
        return -1;
    }
}